

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int deflateSetDictionary(z_streamp strm,Bytef *dictionary,uInt dictLength)

{
  uInt uVar1;
  uInt uVar2;
  uint uVar3;
  deflate_state *s;
  Posf *pPVar4;
  Bytef *pBVar5;
  Bytef *pBVar6;
  Posf *pPVar7;
  int iVar8;
  uInt uVar9;
  uLong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uInt uVar14;
  
  iVar8 = deflateStateCheck(strm);
  iVar11 = -2;
  if ((dictionary != (Bytef *)0x0) && (iVar8 == 0)) {
    s = strm->state;
    iVar8 = s->wrap;
    if (iVar8 != 2) {
      if (iVar8 == 1) {
        if (s->status != 0x2a) {
          return -2;
        }
        if (s->lookahead != 0) {
          return -2;
        }
        uVar10 = adler32(strm->adler,dictionary,dictLength);
        strm->adler = uVar10;
      }
      else if (s->lookahead != 0) {
        return -2;
      }
      s->wrap = 0;
      uVar13 = dictLength;
      if (s->w_size <= dictLength) {
        uVar13 = s->w_size;
        if (iVar8 == 0) {
          pPVar4 = s->head;
          uVar12 = (ulong)(s->hash_size - 1);
          pPVar4[uVar12] = 0;
          memset(pPVar4,0,uVar12 * 2);
          s->strstart = 0;
          s->block_start = 0;
          s->insert = 0;
          uVar13 = s->w_size;
        }
        dictionary = dictionary + (dictLength - uVar13);
      }
      uVar1 = strm->avail_in;
      pBVar5 = strm->next_in;
      strm->avail_in = uVar13;
      strm->next_in = dictionary;
      while( true ) {
        fill_window(s);
        uVar9 = s->strstart;
        uVar13 = s->lookahead;
        if (uVar13 < 3) break;
        iVar11 = uVar13 - 2;
        uVar2 = s->hash_shift;
        pBVar6 = s->window;
        uVar13 = s->hash_mask;
        pPVar4 = s->head;
        pPVar7 = s->prev;
        uVar3 = s->w_mask;
        uVar14 = s->ins_h;
        do {
          uVar14 = ((uint)pBVar6[uVar9 + 2] ^ uVar14 << ((byte)uVar2 & 0x1f)) & uVar13;
          s->ins_h = uVar14;
          pPVar7[uVar3 & uVar9] = pPVar4[uVar14];
          pPVar4[uVar14] = (Posf)uVar9;
          uVar9 = uVar9 + 1;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        s->strstart = uVar9;
        s->lookahead = 2;
      }
      s->strstart = uVar9 + uVar13;
      s->block_start = (ulong)(uVar9 + uVar13);
      s->insert = uVar13;
      s->lookahead = 0;
      s->prev_length = 2;
      s->match_length = 2;
      s->match_available = 0;
      strm->next_in = pBVar5;
      strm->avail_in = uVar1;
      s->wrap = iVar8;
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

int ZEXPORT deflateSetDictionary(z_streamp strm, const Bytef *dictionary,
                                 uInt  dictLength) {
    deflate_state *s;
    uInt str, n;
    int wrap;
    unsigned avail;
    z_const unsigned char *next;

    if (deflateStateCheck(strm) || dictionary == Z_NULL)
        return Z_STREAM_ERROR;
    s = strm->state;
    wrap = s->wrap;
    if (wrap == 2 || (wrap == 1 && s->status != INIT_STATE) || s->lookahead)
        return Z_STREAM_ERROR;

    /* when using zlib wrappers, compute Adler-32 for provided dictionary */
    if (wrap == 1)
        strm->adler = adler32(strm->adler, dictionary, dictLength);
    s->wrap = 0;                    /* avoid computing Adler-32 in read_buf */

    /* if dictionary would fill window, just replace the history */
    if (dictLength >= s->w_size) {
        if (wrap == 0) {            /* already empty otherwise */
            CLEAR_HASH(s);
            s->strstart = 0;
            s->block_start = 0L;
            s->insert = 0;
        }
        dictionary += dictLength - s->w_size;  /* use the tail */
        dictLength = s->w_size;
    }

    /* insert dictionary into window and hash */
    avail = strm->avail_in;
    next = strm->next_in;
    strm->avail_in = dictLength;
    strm->next_in = (z_const Bytef *)dictionary;
    fill_window(s);
    while (s->lookahead >= MIN_MATCH) {
        str = s->strstart;
        n = s->lookahead - (MIN_MATCH-1);
        do {
            UPDATE_HASH(s, s->ins_h, s->window[str + MIN_MATCH-1]);
#ifndef FASTEST
            s->prev[str & s->w_mask] = s->head[s->ins_h];
#endif
            s->head[s->ins_h] = (Pos)str;
            str++;
        } while (--n);
        s->strstart = str;
        s->lookahead = MIN_MATCH-1;
        fill_window(s);
    }
    s->strstart += s->lookahead;
    s->block_start = (long)s->strstart;
    s->insert = s->lookahead;
    s->lookahead = 0;
    s->match_length = s->prev_length = MIN_MATCH-1;
    s->match_available = 0;
    strm->next_in = next;
    strm->avail_in = avail;
    s->wrap = wrap;
    return Z_OK;
}